

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SyncMethod(sqlite3_vtab *pVtab)

{
  int iVar1;
  Fts5FullTable *pTab;
  int rc;
  sqlite3_vtab *pVtab_local;
  
  (pVtab[1].pModule)->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)&pVtab->zErrMsg;
  fts5TripCursors((Fts5FullTable *)pVtab);
  iVar1 = sqlite3Fts5StorageSync((Fts5Storage *)pVtab[1].zErrMsg);
  (pVtab[1].pModule)->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)0x0;
  return iVar1;
}

Assistant:

static int fts5SyncMethod(sqlite3_vtab *pVtab){
  int rc;
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  fts5CheckTransactionState(pTab, FTS5_SYNC, 0);
  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;
  fts5TripCursors(pTab);
  rc = sqlite3Fts5StorageSync(pTab->pStorage);
  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}